

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

void xrep0_pipe_getq_cb(void *arg)

{
  nng_err nVar1;
  nni_msg *msg;
  xrep0_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x18));
  if (nVar1 == NNG_OK) {
    msg = nni_aio_get_msg((nni_aio *)((long)arg + 0x18));
    nni_aio_set_msg((nni_aio *)((long)arg + 0x1e0),msg);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x18),(nni_msg *)0x0);
    nni_pipe_send(*arg,(nni_aio *)((long)arg + 0x1e0));
  }
  else {
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
xrep0_pipe_getq_cb(void *arg)
{
	xrep0_pipe *p = arg;

	if (nni_aio_result(&p->aio_getq) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	nni_aio_set_msg(&p->aio_send, nni_aio_get_msg(&p->aio_getq));
	nni_aio_set_msg(&p->aio_getq, NULL);

	nni_pipe_send(p->pipe, &p->aio_send);
}